

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O3

void __thiscall
chrono::ChFunction::Estimate_y_range
          (ChFunction *this,double xmin,double xmax,double *ymin,double *ymax,int derivate)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_38;
  
  *ymin = 10000.0;
  *ymax = -10000.0;
  if (xmax <= xmin) {
    auVar2 = ZEXT816(0xc0c3880000000000);
  }
  else {
    local_38 = xmin;
    do {
      dVar4 = local_38;
      (*this->_vptr_ChFunction[10])(this,(ulong)(uint)derivate);
      if (dVar4 < *ymin) {
        dVar4 = local_38;
        (*this->_vptr_ChFunction[10])(this,(ulong)(uint)derivate);
        *ymin = dVar4;
      }
      dVar4 = local_38;
      (*this->_vptr_ChFunction[10])(this,(ulong)(uint)derivate);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *ymax;
      if (*ymax < dVar4) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_38;
        (*this->_vptr_ChFunction[10])(this,(ulong)(uint)derivate);
        *ymax = auVar2._0_8_;
      }
      local_38 = local_38 + (xmax - xmin) / 100.0;
    } while (local_38 < xmax);
  }
  dVar4 = *ymin;
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = auVar2._0_8_ - dVar4;
  auVar1 = vandpd_avx512vl(auVar7,auVar1);
  if (auVar1._0_8_ < 1e-11) {
    auVar2 = ZEXT816(0x3ff0000000000000);
    *ymin = -0.5;
    *ymax = 1.0;
    dVar4 = *ymin;
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = auVar2._0_8_ - dVar4;
  auVar2 = vfmadd132sd_fma(auVar5,auVar2,ZEXT816(0x3fbeb851eb851eb8));
  *ymax = auVar2._0_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *ymin;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar2._0_8_ - *ymin;
  auVar2 = vfmadd132sd_fma(auVar6,auVar3,ZEXT816(0xbfbeb851eb851eb8));
  *ymin = auVar2._0_8_;
  return;
}

Assistant:

void ChFunction::Estimate_y_range(double xmin, double xmax, double& ymin, double& ymax, int derivate) const {
    ymin = 10000;
    ymax = -10000;
    for (double mx = xmin; mx < xmax; mx += (xmax - xmin) / 100.0) {
        if (Get_y_dN(mx, derivate) < ymin)
            ymin = Get_y_dN(mx, derivate);
        if (Get_y_dN(mx, derivate) > ymax)
            ymax = Get_y_dN(mx, derivate);
    }
    if (fabs(ymax - ymin) < 10e-12) {
        ymin = -0.5;
        ymax = +1.0;
    }
    ymax += 0.12 * (ymax - ymin);
    ymin -= 0.12 * (ymax - ymin);
}